

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::MergeWindowContours
               (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *a,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *b,ExPolygons *out)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  IntPoint local_178;
  reference local_168;
  IfcVector2 *pip_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2_1;
  IntPoint local_128;
  reference local_118;
  IfcVector2 *pip;
  const_iterator __end2;
  const_iterator __begin2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  Polygon clip;
  Clipper clipper;
  ExPolygons *out_local;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *b_local;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *a_local;
  
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::clear(out);
  ClipperLib::Clipper::Clipper
            ((Clipper *)
             &clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2);
  __end2 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin(a);
  pip = (IfcVector2 *)std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end(a);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                     *)&pip), bVar1) {
    local_118 = __gnu_cxx::
                __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                ::operator*(&__end2);
    dVar7 = local_118->x * 1518500249.0;
    uVar5 = (ulong)dVar7;
    dVar6 = local_118->y * 1518500249.0;
    uVar4 = (ulong)dVar6;
    ClipperLib::IntPoint::IntPoint
              (&local_128,uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f,
               uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2,
               &local_128);
    __gnu_cxx::
    __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = ClipperLib::Orientation((Polygon *)&__range2);
  if (bVar1) {
    iVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range2);
    iVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range2);
    std::
    reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
              ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                )iVar2._M_current,
               (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                )iVar3._M_current);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)
             ((long)&clip.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage +
             clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage[-2].Y),(Polygon *)&__range2,ptSubject
            );
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2);
  __end2_1 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin(b);
  pip_1 = (IfcVector2 *)
          std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end(b);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                             *)&pip_1), bVar1) {
    local_168 = __gnu_cxx::
                __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                ::operator*(&__end2_1);
    dVar7 = local_168->x * 1518500249.0;
    uVar5 = (ulong)dVar7;
    dVar6 = local_168->y * 1518500249.0;
    uVar4 = (ulong)dVar6;
    ClipperLib::IntPoint::IntPoint
              (&local_178,uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f,
               uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2,
               &local_178);
    __gnu_cxx::
    __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
    ::operator++(&__end2_1);
  }
  bVar1 = ClipperLib::Orientation((Polygon *)&__range2);
  if (bVar1) {
    iVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range2);
    iVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &__range2);
    std::
    reverse<__gnu_cxx::__normal_iterator<ClipperLib::IntPoint*,std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
              ((__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                )iVar2._M_current,
               (__normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                )iVar3._M_current);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)
             ((long)&clip.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage +
             clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage[-2].Y),(Polygon *)&__range2,ptSubject
            );
  ClipperLib::Clipper::Execute
            ((Clipper *)
             &clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ctUnion,out,pftNonZero,pftNonZero);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&__range2);
  ClipperLib::Clipper::~Clipper
            ((Clipper *)
             &clip.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void MergeWindowContours (const std::vector<IfcVector2>& a,
    const std::vector<IfcVector2>& b,
    ClipperLib::ExPolygons& out)
{
    out.clear();

    ClipperLib::Clipper clipper;
    ClipperLib::Polygon clip;

    for(const IfcVector2& pip : a) {
        clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    if (ClipperLib::Orientation(clip)) {
        std::reverse(clip.begin(), clip.end());
    }

    clipper.AddPolygon(clip, ClipperLib::ptSubject);
    clip.clear();

    for(const IfcVector2& pip : b) {
        clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    if (ClipperLib::Orientation(clip)) {
        std::reverse(clip.begin(), clip.end());
    }

    clipper.AddPolygon(clip, ClipperLib::ptSubject);
    clipper.Execute(ClipperLib::ctUnion, out,ClipperLib::pftNonZero,ClipperLib::pftNonZero);
}